

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::Parser::ParseJsonName
          (Parser *this,FieldDescriptorProto *field,LocationRecorder *field_location,
          FileDescriptorProto *containing_file)

{
  ErrorCollector *pEVar1;
  bool bVar2;
  string *psVar3;
  LocationRecorder location;
  LocationRecorder local_40;
  long local_30;
  
  if (((field->_has_bits_).has_bits_[0] & 0x10) != 0) {
    local_40.parser_ = (Parser *)&stack0xffffffffffffffd0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"Already set option \"json_name\".","");
    pEVar1 = this->error_collector_;
    if (pEVar1 != (ErrorCollector *)0x0) {
      (*pEVar1->_vptr_ErrorCollector[2])
                (pEVar1,(ulong)(uint)(this->input_->current_).line,
                 (ulong)(uint)(this->input_->current_).column,&local_40);
    }
    this->had_errors_ = true;
    if (local_40.parser_ != (Parser *)&stack0xffffffffffffffd0) {
      operator_delete(local_40.parser_,local_30 + 1);
    }
    psVar3 = (field->json_name_).ptr_;
    if (psVar3 != (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      psVar3->_M_string_length = 0;
      *(psVar3->_M_dataplus)._M_p = '\0';
    }
    *(byte *)(field->_has_bits_).has_bits_ = (byte)(field->_has_bits_).has_bits_[0] & 0xef;
  }
  bVar2 = Consume(this,"json_name");
  if ((bVar2) && (bVar2 = Consume(this,"="), bVar2)) {
    LocationRecorder::LocationRecorder(&local_40,field_location,10);
    LocationRecorder::RecordLegacyLocation(&local_40,&field->super_Message,OPTION_VALUE);
    *(byte *)(field->_has_bits_).has_bits_ = (byte)(field->_has_bits_).has_bits_[0] | 0x10;
    psVar3 = (field->json_name_).ptr_;
    if (psVar3 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstanceNoArena
                (&field->json_name_,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
      psVar3 = (field->json_name_).ptr_;
    }
    bVar2 = ConsumeString(this,psVar3,"Expected string for JSON name.");
    LocationRecorder::~LocationRecorder(&local_40);
    return bVar2;
  }
  return false;
}

Assistant:

bool Parser::ParseJsonName(
    FieldDescriptorProto* field,
    const LocationRecorder& field_location,
    const FileDescriptorProto* containing_file) {
  if (field->has_json_name()) {
    AddError("Already set option \"json_name\".");
    field->clear_json_name();
  }

  DO(Consume("json_name"));
  DO(Consume("="));

  LocationRecorder location(field_location,
                            FieldDescriptorProto::kJsonNameFieldNumber);
  location.RecordLegacyLocation(
      field, DescriptorPool::ErrorCollector::OPTION_VALUE);
  DO(ConsumeString(field->mutable_json_name(),
                   "Expected string for JSON name."));
  return true;
}